

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void __thiscall
charls::process_transformed<charls::transform_none<unsigned_char>_>::encode_transform
          (process_transformed<charls::transform_none<unsigned_char>_> *this,void *source,
          void *destination,size_t pixel_count,size_t destination_stride)

{
  int iVar1;
  interleave_mode iVar2;
  
  if (this->parameters_->output_bgr == true) {
    memcpy((this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start,source,pixel_count * 3);
    transform_rgb_to_bgr<unsigned_char>
              ((this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,(long)this->frame_info_->component_count,
               pixel_count);
    source = (this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  iVar1 = this->frame_info_->component_count;
  if (iVar1 == 4) {
    iVar2 = this->parameters_->interleave_mode;
    if (iVar2 == Line) {
      transform_quad_to_line<charls::transform_none<unsigned_char>,unsigned_char>
                ((quad<unsigned_char> *)source,pixel_count,(uchar *)destination,destination_stride,
                 (transform_none<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
    if (iVar2 == Sample) {
      transform_line<charls::transform_none<unsigned_char>,unsigned_char>
                ((quad<unsigned_char> *)destination,(quad<unsigned_char> *)source,pixel_count,
                 (transform_none<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
  }
  else if (iVar1 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      transform_line<charls::transform_none<unsigned_char>,unsigned_char>
                ((triplet<unsigned_char> *)destination,(triplet<unsigned_char> *)source,pixel_count,
                 (transform_none<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
    transform_triplet_to_line<charls::transform_none<unsigned_char>,unsigned_char>
              ((triplet<unsigned_char> *)source,pixel_count,(uchar *)destination,destination_stride,
               (transform_none<unsigned_char> *)&this->field_0x50,this->mask_);
    return;
  }
  return;
}

Assistant:

void encode_transform(const void* source, void* destination, const size_t pixel_count,
                          const size_t destination_stride) noexcept
    {
        if (parameters_.output_bgr)
        {
            memcpy(temp_line_.data(), source, sizeof(triplet<size_type>) * pixel_count);
            transform_rgb_to_bgr(temp_line_.data(), frame_info_.component_count, pixel_count);
            source = temp_line_.data();
        }

        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else
            {
                transform_triplet_to_line(static_cast<const triplet<size_type>*>(source), pixel_count,
                                          static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_quad_to_line(static_cast<const quad<size_type>*>(source), pixel_count,
                                       static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
    }